

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

lua_Unsigned unbound_search(Table *t,lua_Unsigned j)

{
  lua_Unsigned lVar1;
  TValue *pTVar2;
  ulong key;
  lua_Unsigned m;
  lua_Unsigned i;
  lua_Unsigned j_local;
  Table *t_local;
  
  i = j + 1;
  m = j;
  while( true ) {
    pTVar2 = luaH_getint(t,i);
    lVar1 = m;
    if (pTVar2->tt_ == 0) {
      while (m = lVar1, 1 < i - m) {
        key = m + i >> 1;
        pTVar2 = luaH_getint(t,key);
        lVar1 = key;
        if (pTVar2->tt_ == 0) {
          lVar1 = m;
          i = key;
        }
      }
      return m;
    }
    m = i;
    if (0x3fffffffffffffff < i) break;
    i = i << 1;
  }
  m = 1;
  while (pTVar2 = luaH_getint(t,m), pTVar2->tt_ != 0) {
    m = m + 1;
  }
  return m - 1;
}

Assistant:

static lua_Unsigned unbound_search (Table *t, lua_Unsigned j) {
  lua_Unsigned i = j;  /* i is zero or a present index */
  j++;
  /* find 'i' and 'j' such that i is present and j is not */
  while (!ttisnil(luaH_getint(t, j))) {
    i = j;
    if (j > l_castS2U(LUA_MAXINTEGER) / 2) {  /* overflow? */
      /* table was built with bad purposes: resort to linear search */
      i = 1;
      while (!ttisnil(luaH_getint(t, i))) i++;
      return i - 1;
    }
    j *= 2;
  }
  /* now do a binary search between them */
  while (j - i > 1) {
    lua_Unsigned m = (i+j)/2;
    if (ttisnil(luaH_getint(t, m))) j = m;
    else i = m;
  }
  return i;
}